

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall soul::heart::Printer::PrinterStream::printBlock(PrinterStream *this,Block *b)

{
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  *pvVar1;
  ArrayView<soul::pool_ref<soul::heart::Variable>_> parameters;
  CodePrinter *pCVar2;
  Statement *s;
  Object *s_00;
  Indent IVar3;
  Iterator __begin2;
  Indent statementIndent;
  Indent labelIndent;
  
  IVar3 = choc::text::CodePrinter::createIndent((CodePrinter *)&labelIndent,(size_t)this->out);
  pCVar2 = this->out;
  getBlockName_abi_cxx11_((string *)&statementIndent,(PrinterStream *)b,IVar3._8_8_);
  choc::text::CodePrinter::operator<<(pCVar2,(string *)&statementIndent);
  std::__cxx11::string::~string((string *)&statementIndent);
  pvVar1 = &b->parameters;
  parameters.s = (pvVar1->
                 super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  parameters.e = (pvVar1->
                 super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
  if ((pvVar1->
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (b->parameters).
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    printParameters(this,parameters);
  }
  pCVar2 = choc::text::CodePrinter::operator<<(this->out,":");
  choc::text::CodePrinter::startNewLine(pCVar2);
  choc::text::CodePrinter::createIndent((CodePrinter *)&statementIndent,(size_t)this->out);
  __begin2.object = (b->statements).firstObject;
  while (__begin2.object != (Statement *)0x0) {
    s = LinkedList<soul::heart::Statement>::Iterator::operator*(&__begin2);
    printStatementDescription(this,&s->super_Object);
    pCVar2 = choc::text::CodePrinter::operator<<(this->out,';');
    choc::text::CodePrinter::startNewLine(pCVar2);
    LinkedList<soul::heart::Statement>::Iterator::operator++(&__begin2);
  }
  s_00 = &pool_ptr<soul::heart::Terminator>::operator*(&b->terminator)->super_Object;
  printStatementDescription(this,s_00);
  pCVar2 = choc::text::CodePrinter::operator<<(this->out,';');
  choc::text::CodePrinter::startNewLine(pCVar2);
  choc::text::CodePrinter::Indent::~Indent(&statementIndent);
  choc::text::CodePrinter::Indent::~Indent(&labelIndent);
  return;
}

Assistant:

void printBlock (heart::Block& b)
        {
            auto labelIndent = out.createIndent (2);
            out << getBlockName (b);

            if (!b.parameters.empty())
                printParameters (b.parameters);

            out << ":" << newLine;

            auto statementIndent = out.createIndent (2);

            for (auto s : b.statements)
            {
                printStatementDescription (*s);
                out << ';' << newLine;
            }

            printStatementDescription (*b.terminator);
            out << ';' << newLine;
        }